

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

void __thiscall ApprovalTests::TestName::setFileName(TestName *this,string *file)

{
  TestName *this_00;
  string local_38;
  
  this_00 = (TestName *)file;
  ::std::__cxx11::string::_M_assign((string *)&this->originalFileName);
  if (file->_M_string_length == 0) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  }
  else {
    findFileName(&local_38,this_00,file);
  }
  ::std::__cxx11::string::operator=((string *)&this->fileName,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TestName::setFileName(const std::string& file)
    {
        originalFileName = file;
        fileName = file.empty() ? handleBoostQuirks() : findFileName(file);
    }